

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::DataSourceDescriptor::Serialize(DataSourceDescriptor *this,Message *msg)

{
  uint8_t *src_begin;
  uint uVar1;
  ulong uVar2;
  
  uVar2 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  if ((uVar2 & 2) != 0) {
    protozero::Message::AppendString(msg,1,&this->name_);
    uVar2 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((char)uVar2 < '\0') {
    protozero::Message::AppendVarInt<unsigned_long>(msg,7,this->id_);
    uVar2 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar2 & 4) != 0) {
    protozero::Message::AppendTinyVarInt(msg,2,(uint)this->will_notify_on_stop_);
    uVar2 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar2 & 8) != 0) {
    protozero::Message::AppendTinyVarInt(msg,3,(uint)this->will_notify_on_start_);
    uVar2 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar2 & 0x10) != 0) {
    protozero::Message::AppendTinyVarInt(msg,4,(uint)this->handles_incremental_state_clear_);
    uVar2 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar2 & 0x20) != 0) {
    protozero::Message::AppendString(msg,5,&this->gpu_counter_descriptor_);
    uVar2 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  uVar1 = (uint)uVar2;
  if ((uVar2 & 0x40) != 0) {
    protozero::Message::AppendString(msg,6,&this->track_event_descriptor_);
    uVar1 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar1 >> 8 & 1) != 0) {
    protozero::Message::AppendString(msg,8,&this->ftrace_descriptor_);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void DataSourceDescriptor::Serialize(::protozero::Message* msg) const {
  // Field 1: name
  if (_has_field_[1]) {
    msg->AppendString(1, name_);
  }

  // Field 7: id
  if (_has_field_[7]) {
    msg->AppendVarInt(7, id_);
  }

  // Field 2: will_notify_on_stop
  if (_has_field_[2]) {
    msg->AppendTinyVarInt(2, will_notify_on_stop_);
  }

  // Field 3: will_notify_on_start
  if (_has_field_[3]) {
    msg->AppendTinyVarInt(3, will_notify_on_start_);
  }

  // Field 4: handles_incremental_state_clear
  if (_has_field_[4]) {
    msg->AppendTinyVarInt(4, handles_incremental_state_clear_);
  }

  // Field 5: gpu_counter_descriptor
  if (_has_field_[5]) {
    msg->AppendString(5, gpu_counter_descriptor_);
  }

  // Field 6: track_event_descriptor
  if (_has_field_[6]) {
    msg->AppendString(6, track_event_descriptor_);
  }

  // Field 8: ftrace_descriptor
  if (_has_field_[8]) {
    msg->AppendString(8, ftrace_descriptor_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}